

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

bool __thiscall
Protocol::MQTT::V5::PropertiesView::getProperty(PropertiesView *this,VisitorVariant *visitor)

{
  uint8 propertyType;
  uint uVar1;
  uint8 *puVar2;
  bool bVar3;
  uint32 uVar4;
  MemMappedPropertyRegistry *this_00;
  
  visitor->propType = BadProperty;
  uVar1 = visitor->offset;
  uVar4 = Common::VBInt::operator_cast_to_unsigned_int(&this->length);
  if ((uVar1 < uVar4) && (this->buffer != (uint8 *)0x0)) {
    propertyType = this->buffer[uVar1];
    this_00 = MemMappedPropertyRegistry::getInstance();
    bVar3 = MemMappedPropertyRegistry::getVisitorForProperty(this_00,visitor,propertyType);
    if (bVar3) {
      puVar2 = this->buffer;
      uVar4 = Common::VBInt::operator_cast_to_unsigned_int(&this->length);
      uVar4 = VisitorVariant::acceptBuffer(visitor,puVar2 + (uVar1 + 1),~uVar1 + uVar4);
      bVar3 = uVar4 < 0xfffffffd;
      if (!bVar3) {
        return bVar3;
      }
      visitor->offset = uVar4 + uVar1 + 1;
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool getProperty(VisitorVariant & visitor) const
                {
                    visitor.propertyType(BadProperty);
                    const uint32 offset = visitor.getOffset();
                    if (offset >= (uint32)length || !buffer) return false;
                    // Deduce property type from the given byte
                    uint8 t = buffer[offset];
                    if (!MemMappedPropertyRegistry::getInstance().getVisitorForProperty(visitor, t)) return 0;
                    // Then visit the property now
                    uint32 r = visitor.acceptBuffer(&buffer[offset + 1], (uint32)length - offset - 1);
                    if (isError(r)) return false;
                    visitor.setOffset(offset + r + 1);
                    return true;
                }